

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void fadst8x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [12];
  int iVar20;
  uint uVar21;
  undefined3 in_register_00000011;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar26;
  int iVar27;
  int iVar28;
  __m128i alVar25;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i alVar36;
  short sVar39;
  ushort uVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar41;
  int iVar45;
  int iVar46;
  undefined1 auVar42 [16];
  int iVar47;
  undefined1 auVar43 [16];
  __m128i alVar44;
  int iVar48;
  int iVar50;
  int iVar51;
  undefined1 auVar49 [16];
  int iVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i alVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  iVar20 = CONCAT31(in_register_00000011,cos_bit) - 10;
  uVar21 = av1_sinpi_arr_data[iVar20][2] << 0x10;
  uVar23 = av1_sinpi_arr_data[iVar20][1] & 0xffffU | uVar21;
  auVar59._4_4_ = uVar23;
  auVar59._0_4_ = uVar23;
  auVar59._8_4_ = uVar23;
  auVar59._12_4_ = uVar23;
  iVar24 = (av1_sinpi_arr_data[iVar20][4] & 0xffffU) + av1_sinpi_arr_data[iVar20][1] * -0x10000;
  uVar23 = av1_sinpi_arr_data[iVar20][3];
  uVar22 = av1_sinpi_arr_data[iVar20][4] << 0x10 | uVar23 & 0xffff;
  auVar65._4_4_ = uVar22;
  auVar65._0_4_ = uVar22;
  auVar65._8_4_ = uVar22;
  auVar65._12_4_ = uVar22;
  alVar25 = *input;
  sVar8 = (short)input[1][0];
  sVar9 = *(short *)((long)input[1] + 2);
  sVar10 = *(short *)((long)input[1] + 4);
  sVar11 = *(short *)((long)input[1] + 6);
  sVar12 = (short)input[1][1];
  sVar13 = *(short *)((long)input[1] + 10);
  sVar14 = *(short *)((long)input[1] + 0xc);
  sVar15 = *(short *)((long)input[1] + 0xe);
  alVar36 = input[2];
  alVar44 = input[3];
  sVar39 = sVar11 + alVar25[0]._6_2_;
  uVar40 = sVar12 + (short)alVar25[1];
  auVar19._2_2_ = uVar40;
  auVar19._0_2_ = sVar39;
  auVar71._0_12_ = alVar25._0_12_;
  auVar71._12_2_ = alVar25[0]._6_2_;
  auVar71._14_2_ = sVar11;
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = alVar25._0_10_;
  auVar70._10_2_ = sVar10;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._0_8_ = alVar25[0];
  auVar69._8_2_ = alVar25[0]._4_2_;
  auVar68._8_8_ = auVar69._8_8_;
  auVar68._6_2_ = sVar9;
  auVar68._4_2_ = alVar25[0]._2_2_;
  auVar68._2_2_ = sVar8;
  auVar68._0_2_ = (short)alVar25[0];
  auVar67._2_2_ = sVar12;
  auVar67._0_2_ = (short)alVar25[1];
  auVar67._4_2_ = alVar25[1]._2_2_;
  auVar67._6_2_ = sVar13;
  auVar67._8_2_ = alVar25[1]._4_2_;
  auVar67._10_2_ = sVar14;
  auVar67._12_2_ = alVar25[1]._6_2_;
  auVar67._14_2_ = sVar15;
  auVar73._0_12_ = alVar36._0_12_;
  auVar73._12_2_ = alVar36[0]._6_2_;
  auVar73._14_2_ = alVar44[0]._6_2_;
  auVar57._12_4_ = auVar73._12_4_;
  auVar57._0_10_ = alVar36._0_10_;
  auVar57._10_2_ = alVar44[0]._4_2_;
  auVar72._10_6_ = auVar57._10_6_;
  auVar72._0_8_ = alVar36[0];
  auVar72._8_2_ = alVar36[0]._4_2_;
  auVar42._8_8_ = auVar72._8_8_;
  auVar42._6_2_ = alVar44[0]._2_2_;
  auVar42._0_4_ = (uint)alVar36[0];
  auVar42._4_2_ = alVar36[0]._2_2_;
  auVar34._4_12_ = auVar42._4_12_;
  auVar34._0_2_ = (undefined2)alVar36[0];
  auVar34._2_2_ = (short)alVar44[0];
  auVar49._2_2_ = (ushort)alVar44[1];
  auVar49._0_2_ = (ushort)alVar36[1];
  auVar49._4_2_ = alVar36[1]._2_2_;
  auVar49._6_2_ = alVar44[1]._2_2_;
  auVar49._8_2_ = alVar36[1]._4_2_;
  auVar49._10_2_ = alVar44[1]._4_2_;
  auVar49._12_2_ = alVar36[1]._6_2_;
  auVar49._14_2_ = alVar44[1]._6_2_;
  auVar19._4_8_ = 0;
  auVar3._12_2_ = sVar39;
  auVar3._0_12_ = auVar19 << 0x30;
  auVar16._6_8_ = 0;
  auVar16._0_6_ =
       (uint6)(CONCAT44(auVar3._10_4_,CONCAT22(sVar10 + alVar25[0]._4_2_,sVar39)) >> 0x10);
  auVar33._6_8_ = SUB148(auVar16 << 0x40,6);
  auVar33._4_2_ = sVar9 + alVar25[0]._2_2_;
  auVar33._2_2_ = 0;
  auVar33._0_2_ = sVar8 + (short)alVar25[0];
  auVar33._14_2_ = 0;
  auVar37._2_2_ = 0;
  auVar37._0_2_ = uVar40;
  auVar37._4_2_ = sVar13 + alVar25[1]._2_2_;
  auVar37._6_2_ = 0;
  auVar37._8_2_ = sVar14 + alVar25[1]._4_2_;
  auVar37._10_2_ = 0;
  auVar37._12_2_ = sVar15 + alVar25[1]._6_2_;
  auVar37._14_2_ = 0;
  auVar1._10_2_ = 0;
  auVar1._0_10_ = auVar57._0_10_;
  auVar1._12_2_ = alVar36[0]._6_2_;
  auVar4._8_2_ = alVar36[0]._4_2_;
  auVar4._0_8_ = auVar72._0_8_;
  auVar4._10_4_ = auVar1._10_4_;
  auVar17._6_8_ = 0;
  auVar17._0_6_ = auVar4._8_6_;
  auVar6._4_2_ = alVar36[0]._2_2_;
  auVar6._0_4_ = auVar42._0_4_;
  auVar6._6_8_ = SUB148(auVar17 << 0x40,6);
  auVar64._0_4_ = auVar42._0_4_ & 0xffff;
  auVar64._4_10_ = auVar6._4_10_;
  auVar64._14_2_ = 0;
  auVar56._2_2_ = 0;
  auVar56._0_2_ = (ushort)alVar36[1];
  auVar56._4_2_ = alVar36[1]._2_2_;
  auVar56._6_2_ = 0;
  auVar56._8_2_ = alVar36[1]._4_2_;
  auVar56._10_2_ = 0;
  auVar56._12_2_ = alVar36[1]._6_2_;
  auVar56._14_2_ = 0;
  auVar2._10_2_ = 0;
  auVar2._0_10_ = alVar44._0_10_;
  auVar2._12_2_ = alVar44[0]._6_2_;
  auVar5._8_2_ = alVar44[0]._4_2_;
  auVar5._0_8_ = alVar44[0];
  auVar5._10_4_ = auVar2._10_4_;
  auVar18._6_8_ = 0;
  auVar18._0_6_ = auVar5._8_6_;
  auVar7._4_2_ = alVar44[0]._2_2_;
  auVar7._0_4_ = (uint)alVar44[0];
  auVar7._6_8_ = SUB148(auVar18 << 0x40,6);
  auVar61._0_4_ = (uint)alVar44[0] & 0xffff;
  auVar61._4_10_ = auVar7._4_10_;
  auVar61._14_2_ = 0;
  auVar53._2_2_ = 0;
  auVar53._0_2_ = (ushort)alVar44[1];
  auVar53._4_2_ = alVar44[1]._2_2_;
  auVar53._6_2_ = 0;
  auVar53._8_2_ = alVar44[1]._4_2_;
  auVar53._10_2_ = 0;
  auVar53._12_2_ = alVar44[1]._6_2_;
  auVar53._14_2_ = 0;
  auVar73 = pmaddwd(auVar68,auVar59);
  auVar42 = pmaddwd(auVar34,auVar65);
  iVar41 = auVar42._0_4_ + auVar73._0_4_;
  iVar45 = auVar42._4_4_ + auVar73._4_4_;
  iVar46 = auVar42._8_4_ + auVar73._8_4_;
  iVar47 = auVar42._12_4_ + auVar73._12_4_;
  auVar74._4_4_ = iVar24;
  auVar74._0_4_ = iVar24;
  auVar74._8_4_ = iVar24;
  auVar74._12_4_ = iVar24;
  auVar73 = pmaddwd(auVar59,auVar67);
  auVar42 = pmaddwd(auVar65,auVar49);
  iVar29 = auVar42._0_4_ + auVar73._0_4_;
  iVar30 = auVar42._4_4_ + auVar73._4_4_;
  iVar31 = auVar42._8_4_ + auVar73._8_4_;
  iVar32 = auVar42._12_4_ + auVar73._12_4_;
  uVar21 = -uVar23 & 0xffff | uVar21;
  auVar72 = pmaddwd(auVar68,auVar74);
  auVar73 = pmaddwd(auVar67,auVar74);
  auVar75._4_4_ = uVar21;
  auVar75._0_4_ = uVar21;
  auVar75._8_4_ = uVar21;
  auVar75._12_4_ = uVar21;
  auVar42 = pmaddwd(auVar34,auVar75);
  iVar24 = auVar42._0_4_ + auVar72._0_4_;
  iVar26 = auVar42._4_4_ + auVar72._4_4_;
  iVar27 = auVar42._8_4_ + auVar72._8_4_;
  iVar28 = auVar42._12_4_ + auVar72._12_4_;
  auVar42 = pmaddwd(auVar49,auVar75);
  iVar48 = auVar42._0_4_ + auVar73._0_4_;
  iVar50 = auVar42._4_4_ + auVar73._4_4_;
  iVar51 = auVar42._8_4_ + auVar73._8_4_;
  iVar52 = auVar42._12_4_ + auVar73._12_4_;
  auVar42 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
  auVar60._0_4_ = auVar42._0_4_;
  auVar60._4_4_ = auVar60._0_4_;
  auVar60._8_4_ = auVar60._0_4_;
  auVar60._12_4_ = auVar60._0_4_;
  iVar20 = 1 << (cos_bit - 1U & 0x1f);
  auVar34 = pmaddwd(auVar33,auVar60);
  auVar73 = pmaddwd(auVar37,auVar60);
  auVar65 = pmaddwd(auVar64,auVar60);
  auVar57 = pmaddwd(auVar56,auVar60);
  auVar62 = pmaddwd(auVar61,auVar60);
  auVar72 = pmaddwd(auVar53,auVar60);
  auVar42 = ZEXT416(CONCAT31(in_register_00000011,cos_bit));
  auVar43._0_4_ = iVar41 + iVar20 >> auVar42;
  auVar43._4_4_ = iVar45 + iVar20 >> auVar42;
  auVar43._8_4_ = iVar46 + iVar20 >> auVar42;
  auVar43._12_4_ = iVar47 + iVar20 >> auVar42;
  auVar63._0_4_ = iVar29 + iVar20 >> auVar42;
  auVar63._4_4_ = iVar30 + iVar20 >> auVar42;
  auVar63._8_4_ = iVar31 + iVar20 >> auVar42;
  auVar63._12_4_ = iVar32 + iVar20 >> auVar42;
  auVar35._0_4_ = (auVar34._0_4_ + iVar20) - auVar62._0_4_ >> auVar42;
  auVar35._4_4_ = (auVar34._4_4_ + iVar20) - auVar62._4_4_ >> auVar42;
  auVar35._8_4_ = (auVar34._8_4_ + iVar20) - auVar62._8_4_ >> auVar42;
  auVar35._12_4_ = (auVar34._12_4_ + iVar20) - auVar62._12_4_ >> auVar42;
  auVar38._0_4_ = (auVar73._0_4_ + iVar20) - auVar72._0_4_ >> auVar42;
  auVar38._4_4_ = (auVar73._4_4_ + iVar20) - auVar72._4_4_ >> auVar42;
  auVar38._8_4_ = (auVar73._8_4_ + iVar20) - auVar72._8_4_ >> auVar42;
  auVar38._12_4_ = (auVar73._12_4_ + iVar20) - auVar72._12_4_ >> auVar42;
  alVar44 = (__m128i)packssdw(auVar43,auVar63);
  alVar36 = (__m128i)packssdw(auVar35,auVar38);
  auVar62._0_4_ = iVar24 + iVar20 >> auVar42;
  auVar62._4_4_ = iVar26 + iVar20 >> auVar42;
  auVar62._8_4_ = iVar27 + iVar20 >> auVar42;
  auVar62._12_4_ = iVar28 + iVar20 >> auVar42;
  auVar66._0_4_ = iVar48 + iVar20 >> auVar42;
  auVar66._4_4_ = iVar50 + iVar20 >> auVar42;
  auVar66._8_4_ = iVar51 + iVar20 >> auVar42;
  auVar66._12_4_ = iVar52 + iVar20 >> auVar42;
  auVar54._0_4_ = (iVar20 - iVar41) + iVar24 + auVar65._0_4_ * 3 >> auVar42;
  auVar54._4_4_ = (iVar20 - iVar45) + iVar26 + auVar65._4_4_ * 3 >> auVar42;
  auVar54._8_4_ = (iVar20 - iVar46) + iVar27 + auVar65._8_4_ * 3 >> auVar42;
  auVar54._12_4_ = (iVar20 - iVar47) + iVar28 + auVar65._12_4_ * 3 >> auVar42;
  alVar25 = (__m128i)packssdw(auVar62,auVar66);
  auVar58._0_4_ = (iVar20 - iVar29) + iVar48 + auVar57._0_4_ * 3 >> auVar42;
  auVar58._4_4_ = (iVar20 - iVar30) + iVar50 + auVar57._4_4_ * 3 >> auVar42;
  auVar58._8_4_ = (iVar20 - iVar31) + iVar51 + auVar57._8_4_ * 3 >> auVar42;
  auVar58._12_4_ = (iVar20 - iVar32) + iVar52 + auVar57._12_4_ * 3 >> auVar42;
  alVar55 = (__m128i)packssdw(auVar54,auVar58);
  *output = alVar44;
  output[1] = alVar36;
  output[2] = alVar25;
  output[3] = alVar55;
  return;
}

Assistant:

static void fadst8x4_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *sinpi = sinpi_arr(cos_bit);
  const __m128i sinpi_p01_p02 = pair_set_epi16(sinpi[1], sinpi[2]);
  const __m128i sinpi_p04_m01 = pair_set_epi16(sinpi[4], -sinpi[1]);
  const __m128i sinpi_p03_p04 = pair_set_epi16(sinpi[3], sinpi[4]);
  const __m128i sinpi_m03_p02 = pair_set_epi16(-sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_p03 = _mm_set1_epi16((int16_t)sinpi[3]);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  const __m128i in7 = _mm_add_epi16(input[0], input[1]);
  __m128i u_lo[8], u_hi[8], v_lo[8], v_hi[8];

  u_lo[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u_hi[0] = _mm_unpackhi_epi16(input[0], input[1]);
  u_lo[1] = _mm_unpacklo_epi16(input[2], input[3]);
  u_hi[1] = _mm_unpackhi_epi16(input[2], input[3]);
  u_lo[2] = _mm_unpacklo_epi16(in7, __zero);
  u_hi[2] = _mm_unpackhi_epi16(in7, __zero);
  u_lo[3] = _mm_unpacklo_epi16(input[2], __zero);
  u_hi[3] = _mm_unpackhi_epi16(input[2], __zero);
  u_lo[4] = _mm_unpacklo_epi16(input[3], __zero);
  u_hi[4] = _mm_unpackhi_epi16(input[3], __zero);

  v_lo[0] = _mm_madd_epi16(u_lo[0], sinpi_p01_p02);  // s0 + s2
  v_hi[0] = _mm_madd_epi16(u_hi[0], sinpi_p01_p02);  // s0 + s2
  v_lo[1] = _mm_madd_epi16(u_lo[1], sinpi_p03_p04);  // s4 + s5
  v_hi[1] = _mm_madd_epi16(u_hi[1], sinpi_p03_p04);  // s4 + s5
  v_lo[2] = _mm_madd_epi16(u_lo[2], sinpi_p03_p03);  // x1
  v_hi[2] = _mm_madd_epi16(u_hi[2], sinpi_p03_p03);  // x1
  v_lo[3] = _mm_madd_epi16(u_lo[0], sinpi_p04_m01);  // s1 - s3
  v_hi[3] = _mm_madd_epi16(u_hi[0], sinpi_p04_m01);  // s1 - s3
  v_lo[4] = _mm_madd_epi16(u_lo[1], sinpi_m03_p02);  // -s4 + s6
  v_hi[4] = _mm_madd_epi16(u_hi[1], sinpi_m03_p02);  // -s4 + s6
  v_lo[5] = _mm_madd_epi16(u_lo[3], sinpi_p03_p03);  // s4
  v_hi[5] = _mm_madd_epi16(u_hi[3], sinpi_p03_p03);  // s4
  v_lo[6] = _mm_madd_epi16(u_lo[4], sinpi_p03_p03);
  v_hi[6] = _mm_madd_epi16(u_hi[4], sinpi_p03_p03);

  u_lo[0] = _mm_add_epi32(v_lo[0], v_lo[1]);
  u_hi[0] = _mm_add_epi32(v_hi[0], v_hi[1]);
  u_lo[1] = _mm_sub_epi32(v_lo[2], v_lo[6]);
  u_hi[1] = _mm_sub_epi32(v_hi[2], v_hi[6]);
  u_lo[2] = _mm_add_epi32(v_lo[3], v_lo[4]);
  u_hi[2] = _mm_add_epi32(v_hi[3], v_hi[4]);
  u_lo[3] = _mm_sub_epi32(u_lo[2], u_lo[0]);
  u_hi[3] = _mm_sub_epi32(u_hi[2], u_hi[0]);
  u_lo[4] = _mm_slli_epi32(v_lo[5], 2);
  u_hi[4] = _mm_slli_epi32(v_hi[5], 2);
  u_lo[5] = _mm_sub_epi32(u_lo[4], v_lo[5]);
  u_hi[5] = _mm_sub_epi32(u_hi[4], v_hi[5]);
  u_lo[6] = _mm_add_epi32(u_lo[3], u_lo[5]);
  u_hi[6] = _mm_add_epi32(u_hi[3], u_hi[5]);

  v_lo[0] = _mm_add_epi32(u_lo[0], __rounding);
  v_hi[0] = _mm_add_epi32(u_hi[0], __rounding);
  v_lo[1] = _mm_add_epi32(u_lo[1], __rounding);
  v_hi[1] = _mm_add_epi32(u_hi[1], __rounding);
  v_lo[2] = _mm_add_epi32(u_lo[2], __rounding);
  v_hi[2] = _mm_add_epi32(u_hi[2], __rounding);
  v_lo[3] = _mm_add_epi32(u_lo[6], __rounding);
  v_hi[3] = _mm_add_epi32(u_hi[6], __rounding);

  u_lo[0] = _mm_srai_epi32(v_lo[0], cos_bit);
  u_hi[0] = _mm_srai_epi32(v_hi[0], cos_bit);
  u_lo[1] = _mm_srai_epi32(v_lo[1], cos_bit);
  u_hi[1] = _mm_srai_epi32(v_hi[1], cos_bit);
  u_lo[2] = _mm_srai_epi32(v_lo[2], cos_bit);
  u_hi[2] = _mm_srai_epi32(v_hi[2], cos_bit);
  u_lo[3] = _mm_srai_epi32(v_lo[3], cos_bit);
  u_hi[3] = _mm_srai_epi32(v_hi[3], cos_bit);

  output[0] = _mm_packs_epi32(u_lo[0], u_hi[0]);
  output[1] = _mm_packs_epi32(u_lo[1], u_hi[1]);
  output[2] = _mm_packs_epi32(u_lo[2], u_hi[2]);
  output[3] = _mm_packs_epi32(u_lo[3], u_hi[3]);
}